

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

OptionStatus checkOption(HighsLogOptions *report_log_options,OptionRecordDouble *option)

{
  double dVar1;
  double dVar2;
  pointer pcVar3;
  char *format;
  
  dVar1 = option->lower_bound;
  dVar2 = option->upper_bound;
  if (dVar1 <= dVar2) {
    if ((option->default_value < dVar1) || (dVar2 < option->default_value)) {
      pcVar3 = (option->super_OptionRecord).name._M_dataplus._M_p;
      format = "checkOption: Option \"%s\" has default value %g inconsistent with bounds [%g, %g]\n"
      ;
    }
    else {
      if ((dVar1 <= *option->value) && (*option->value <= dVar2)) {
        return kOk;
      }
      pcVar3 = (option->super_OptionRecord).name._M_dataplus._M_p;
      format = "checkOption: Option \"%s\" has value %g inconsistent with bounds [%g, %g]\n";
    }
    highsLogUser(report_log_options,kError,format,pcVar3);
  }
  else {
    highsLogUser(report_log_options,kError,
                 "checkOption: Option \"%s\" has inconsistent bounds [%g, %g]\n",dVar1,dVar2,
                 (option->super_OptionRecord).name._M_dataplus._M_p);
  }
  return kIllegalValue;
}

Assistant:

OptionStatus checkOption(const HighsLogOptions& report_log_options,
                         const OptionRecordDouble& option) {
  if (option.lower_bound > option.upper_bound) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "checkOption: Option \"%s\" has inconsistent bounds [%g, %g]\n",
        option.name.c_str(), option.lower_bound, option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  if (option.default_value < option.lower_bound ||
      option.default_value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "checkOption: Option \"%s\" has default value %g "
                 "inconsistent with bounds [%g, %g]\n",
                 option.name.c_str(), option.default_value, option.lower_bound,
                 option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  double value = *option.value;
  if (value < option.lower_bound || value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "checkOption: Option \"%s\" has value %g inconsistent with "
                 "bounds [%g, %g]\n",
                 option.name.c_str(), value, option.lower_bound,
                 option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}